

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketAcceptor.cpp
# Opt level: O1

void __thiscall
FIX::SocketAcceptor::onConnect
          (SocketAcceptor *this,SocketServer *server,socket_handle a,socket_handle s)

{
  _Rb_tree_header *p_Var1;
  NullLog *pNVar2;
  int s_00;
  bool bVar3;
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  *__x;
  SocketConnection *this_00;
  mapped_type *ppSVar4;
  char *__s;
  size_t sVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  NullLog *pNVar8;
  int port;
  Sessions sessions;
  stringstream stream;
  int local_238;
  int local_234;
  long *local_230 [2];
  long local_220 [2];
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  local_210;
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  local_1e0;
  stringstream local_1b0 [16];
  long local_1a0 [14];
  ios_base local_130 [264];
  
  local_238 = s;
  bVar3 = socket_isValid(s);
  if (bVar3) {
    p_Var1 = &(this->m_connections)._M_t._M_impl.super__Rb_tree_header;
    p_Var7 = (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var6 = &p_Var1->_M_header;
    for (; p_Var7 != (_Base_ptr)0x0;
        p_Var7 = (&p_Var7->_M_left)[(int)p_Var7[1]._M_color < local_238]) {
      if (local_238 <= (int)p_Var7[1]._M_color) {
        p_Var6 = p_Var7;
      }
    }
    p_Var7 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
       (p_Var7 = p_Var6, local_238 < (int)p_Var6[1]._M_color)) {
      p_Var7 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var7 == p_Var1) {
      local_234 = SocketServer::socketToPort(server,a);
      __x = &std::
             map<int,_std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>_>_>_>
             ::operator[](&this->m_portToSessions,&local_234)->_M_t;
      std::
      _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
      ::_Rb_tree(&local_1e0,__x);
      this_00 = (SocketConnection *)operator_new(0x2180);
      s_00 = local_238;
      std::
      _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
      ::_Rb_tree(&local_210,&local_1e0);
      SocketConnection::SocketConnection(this_00,s_00,(Sessions *)&local_210,&server->m_monitor);
      ppSVar4 = std::
                map<int,_FIX::SocketConnection_*,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
                ::operator[](&this->m_connections,&local_238);
      *ppSVar4 = this_00;
      std::
      _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
      ::~_Rb_tree(&local_210);
      std::__cxx11::stringstream::stringstream(local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,"Accepted connection from ",0x19);
      __s = socket_peername(local_238);
      if (__s == (char *)0x0) {
        std::ios::clear((int)(ostream *)local_1a0 + (int)*(undefined8 *)(local_1a0[0] + -0x18));
      }
      else {
        sVar5 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,__s,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," on port ",9);
      std::ostream::operator<<((ostream *)local_1a0,local_234);
      pNVar2 = (NullLog *)(this->super_Acceptor).m_pLog;
      std::__cxx11::stringbuf::str();
      pNVar8 = &(this->super_Acceptor).m_nullLog;
      if (pNVar2 != (NullLog *)0x0) {
        pNVar8 = pNVar2;
      }
      (*(pNVar8->super_Log)._vptr_Log[6])(pNVar8,local_230);
      if (local_230[0] != local_220) {
        operator_delete(local_230[0],local_220[0] + 1);
      }
      std::__cxx11::stringstream::~stringstream(local_1b0);
      std::ios_base::~ios_base(local_130);
      std::
      _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
      ::~_Rb_tree(&local_1e0);
    }
  }
  return;
}

Assistant:

void SocketAcceptor::onConnect( SocketServer& server, socket_handle a, socket_handle s )
{
  if ( !socket_isValid( s ) ) return;
  SocketConnections::iterator i = m_connections.find( s );
  if ( i != m_connections.end() ) return;
  int port = server.socketToPort( a );
  Sessions sessions = m_portToSessions[port];
  m_connections[ s ] = new SocketConnection( s, sessions, &server.getMonitor() );

  std::stringstream stream;
  stream << "Accepted connection from " << socket_peername( s ) << " on port " << port;

  if( getLog() )
    getLog()->onEvent( stream.str() );
}